

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getDigits(char *zDate,...)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint *puVar11;
  uint *local_e0;
  uint local_c8 [18];
  va_list ap;
  
  local_e0 = (uint *)&stack0x00000008;
  uVar1 = 8;
  iVar2 = 0;
  do {
    uVar9 = (ulong)uVar1;
    if (uVar9 < 0x29) {
      uVar4 = *(uint *)((long)local_c8 + uVar9);
      uVar7 = uVar1 + 8;
      if (0x20 < uVar1) goto LAB_00184388;
      uVar7 = uVar1 + 0x10;
      uVar3 = *(uint *)((long)local_c8 + uVar9 + 8);
      if (0x18 < uVar1) goto LAB_00184398;
      uVar7 = uVar1 + 0x18;
      uVar6 = *(uint *)((long)local_c8 + uVar9 + 0x10);
      if (0x10 < uVar1) goto LAB_001843a8;
      uVar7 = uVar1 | 0x20;
      uVar8 = *(uint *)((long)local_c8 + uVar9 + 0x18);
      if (0x28 < uVar7) goto LAB_001843b9;
      puVar11 = (uint *)((long)local_c8 + (ulong)uVar7);
      uVar1 = uVar1 + 0x28;
    }
    else {
      uVar4 = *local_e0;
      local_e0 = local_e0 + 2;
      uVar7 = uVar1;
LAB_00184388:
      uVar3 = *local_e0;
      local_e0 = local_e0 + 2;
LAB_00184398:
      uVar6 = *local_e0;
      local_e0 = local_e0 + 2;
LAB_001843a8:
      uVar8 = *local_e0;
      local_e0 = local_e0 + 2;
LAB_001843b9:
      puVar11 = local_e0;
      local_e0 = local_e0 + 2;
      uVar1 = uVar7;
    }
    iVar10 = 0;
    for (lVar5 = 0; uVar4 != (uint)lVar5; lVar5 = lVar5 + 1) {
      if ((ulong)(byte)zDate[lVar5] - 0x3a < 0xfffffffffffffff6) {
        return iVar2;
      }
      iVar10 = iVar10 * 10 + (int)zDate[lVar5] + -0x30;
    }
    if (iVar10 < (int)uVar3) {
      return iVar2;
    }
    if ((int)uVar6 < iVar10) {
      return iVar2;
    }
    if (uVar8 == 0) {
      **(int **)puVar11 = iVar10;
      return iVar2 + 1;
    }
    if (uVar8 != (int)zDate[uVar4]) {
      return iVar2;
    }
    **(int **)puVar11 = iVar10;
    zDate = zDate + uVar4 + 1;
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static int getDigits(const char *zDate, ...){
  va_list ap;
  int val;
  int N;
  int min;
  int max;
  int nextC;
  int *pVal;
  int cnt = 0;
  va_start(ap, zDate);
  do{
    N = va_arg(ap, int);
    min = va_arg(ap, int);
    max = va_arg(ap, int);
    nextC = va_arg(ap, int);
    pVal = va_arg(ap, int*);
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<min || val>max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *pVal = val;
    zDate++;
    cnt++;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}